

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void addPaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  
  if (h != 0) {
    uVar3 = 0;
    uVar4 = 0;
    uVar1 = 0;
    do {
      sVar5 = ilinebits;
      uVar7 = uVar4;
      if (ilinebits != 0) {
        do {
          bVar2 = '\x01' << (~(byte)uVar1 & 7);
          if ((in[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) == 0) {
            out[uVar1 >> 3] = out[uVar1 >> 3] & ~bVar2;
          }
          else {
            out[uVar1 >> 3] = out[uVar1 >> 3] | bVar2;
          }
          uVar1 = uVar1 + 1;
          sVar5 = sVar5 - 1;
          uVar7 = uVar7 + 1;
        } while (sVar5 != 0);
        uVar4 = uVar4 + ilinebits;
      }
      lVar6 = olinebits - ilinebits;
      if (olinebits != ilinebits) {
        do {
          bVar2 = ~(byte)uVar1 & 7;
          out[uVar1 >> 3] = out[uVar1 >> 3] & (-2 << bVar2 | 0xfeU >> 8 - bVar2);
          uVar1 = uVar1 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != h);
  }
  return;
}

Assistant:

static void addPaddingBits(unsigned char* out, const unsigned char* in,
  size_t olinebits, size_t ilinebits, unsigned h) {
  /*The opposite of the removePaddingBits function
  olinebits must be >= ilinebits*/
  unsigned y;
  size_t diff = olinebits - ilinebits;
  size_t obp = 0, ibp = 0; /*bit pointers*/
  for (y = 0; y != h; ++y) {
    size_t x;
    for (x = 0; x < ilinebits; ++x) {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    /*obp += diff; --> no, fill in some value in the padding bits too, to avoid
    "Use of uninitialised value of size ###" warning from valgrind*/
    for (x = 0; x != diff; ++x) setBitOfReversedStream(&obp, out, 0);
  }
}